

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O3

void __thiscall psy::C::SyntaxWriterDOTFormat::generateTokens(SyntaxWriterDOTFormat *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  SyntaxToken *pSVar3;
  SyntaxWriterDOTFormat *pSVar4;
  uint token;
  SyntaxWriterDOTFormat *pSVar5;
  string t;
  string local_78;
  value_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  sVar2 = SyntaxTree::tokenCount((this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
  if (1 < sVar2) {
    paVar1 = &local_78.field_2;
    local_38 = &this->terminalShapes_;
    pSVar5 = (SyntaxWriterDOTFormat *)0x1;
    do {
      pSVar4 = pSVar5;
      pSVar3 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                   (IndexType)pSVar5);
      if (pSVar3->syntaxK_ == EndOfFile) {
        return;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      token = (uint)pSVar5;
      terminalId_abi_cxx11_(&local_78,pSVar4,token);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      pSVar3 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                   (IndexType)pSVar5);
      SyntaxToken::valueText_abi_cxx11_(&local_78,pSVar3);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_58);
      if (1 < token) {
        pSVar5 = (SyntaxWriterDOTFormat *)0x465c76;
        std::__cxx11::string::append((char *)&local_58);
        terminalId_abi_cxx11_(&local_78,pSVar5,token - 1);
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pSVar5 = (SyntaxWriterDOTFormat *)0x4653c5;
        std::__cxx11::string::append((char *)&local_58);
        terminalId_abi_cxx11_(&local_78,pSVar5,token);
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_58);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_38,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      pSVar5 = (SyntaxWriterDOTFormat *)(ulong)(token + 1);
      pSVar4 = (SyntaxWriterDOTFormat *)
               SyntaxTree::tokenCount((this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
    } while (pSVar5 < pSVar4);
  }
  return;
}

Assistant:

void SyntaxWriterDOTFormat::generateTokens() {
    for (unsigned token = 1; token < tree_->tokenCount(); ++token) {
        if (tree_->tokenAt(token).kind() == SyntaxKind::EndOfFile)
            break;

        std::string t;
        t.append(terminalId(token));
        t.append(" [shape=rect label = \"");
        t.append(tree_->tokenAt(token).valueText());
        t.append("\"]");

        if (token > 1) {
            t.append("; ");
            t.append(terminalId(token - 1));
            t.append(" -> ");
            t.append(terminalId(token));
            t.append(" [arrowhead=\"vee\" color=\"transparent\"]");
        }

        terminalShapes_.push_back(t);
    }
}